

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.cpp
# Opt level: O2

void __thiscall CaDiCaL::External::remove_observed_var(External *this,int elit)

{
  uint uVar1;
  ulong __n;
  reference rVar2;
  
  if (this->propagator != (ExternalPropagator *)0x0) {
    uVar1 = -elit;
    if (0 < elit) {
      uVar1 = elit;
    }
    if ((int)uVar1 <= this->max_var) {
      __n = (ulong)uVar1;
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_observed,__n);
      if ((*rVar2._M_p & rVar2._M_mask) != 0) {
        Internal::remove_observed_var
                  (this->internal,
                   (this->e2i).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[__n]);
        rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_observed,__n);
        *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
        melt(this,elit);
        return;
      }
    }
  }
  return;
}

Assistant:

void External::remove_observed_var (int elit) {
  if (!propagator) {
    LOG ("No connected propagator that could have watched the variable");
    return;
  }
  int eidx = abs (elit);

  if (eidx > max_var)
    return;

  if (is_observed[eidx]) {
    // Follow opposite order of add_observed_var, first remove internal
    // is_observed
    int ilit = e2i[eidx]; // internalize (elit);
    internal->remove_observed_var (ilit);

    is_observed[eidx] = false;
    melt (elit);
    LOG ("unmarking %d as externally watched", eidx);
  }
}